

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_check_minmax(t_slider *x,double min,double max,t_float value)

{
  double dVar1;
  double dStack_20;
  t_float value_local;
  double max_local;
  double min_local;
  t_slider *x_local;
  
  dStack_20 = max;
  max_local = min;
  if (x->x_lin0_log1 != 0) {
    if ((((min == 0.0) && (!NAN(min))) && (max == 0.0)) && (!NAN(max))) {
      dStack_20 = 1.0;
    }
    if (dStack_20 <= 0.0) {
      if (0.0 < min) {
        dStack_20 = min * 0.01;
      }
    }
    else if (min <= 0.0) {
      max_local = dStack_20 * 0.01;
    }
  }
  x->x_min = max_local;
  x->x_max = dStack_20;
  if (x->x_lin0_log1 == 0) {
    x->x_k = (x->x_max - x->x_min) / (double)(value / (float)((x->x_gui).x_glist)->gl_zoom - 1.0);
  }
  else {
    dVar1 = log(x->x_max / x->x_min);
    x->x_k = dVar1 / (double)(value / (float)((x->x_gui).x_glist)->gl_zoom - 1.0);
  }
  return;
}

Assistant:

static void slider_check_minmax(t_slider *x, double min, double max, t_float value)
{
    if(x->x_lin0_log1)
    {
        if((min == 0.0) && (max == 0.0))
            max = 1.0;
        if(max > 0.0)
        {
            if(min <= 0.0)
                min = 0.01 * max;
        }
        else
        {
            if(min > 0.0)
                max = 0.01 * min;
        }
    }
    x->x_min = min;
    x->x_max = max;
    if(x->x_lin0_log1)
        x->x_k = log(x->x_max/x->x_min) / (double)(value/IEMGUI_ZOOM(x) - 1);
    else
        x->x_k = (x->x_max - x->x_min) / (double)(value/IEMGUI_ZOOM(x) - 1);
}